

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

int Extra_bddSuppOverlapping(DdManager *dd,DdNode *S1,DdNode *S2)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = S1->index;
  while( true ) {
    if (uVar2 == 0x7fffffff) {
      return 0;
    }
    uVar1 = S2->index;
    if ((ulong)uVar1 == 0x7fffffff) break;
    if (uVar2 == uVar1) {
      return 1;
    }
    if (dd->perm[uVar2] < dd->perm[uVar1]) {
      S1 = (S1->type).kids.T;
    }
    else {
      S2 = (S2->type).kids.T;
    }
    uVar2 = S1->index;
  }
  return 0;
}

Assistant:

int Extra_bddSuppOverlapping( DdManager * dd, DdNode * S1, DdNode * S2 )
{
    while ( S1->index != CUDD_CONST_INDEX && S2->index != CUDD_CONST_INDEX )
    {
        // if the top vars are the same, they intersect
        if ( S1->index == S2->index )
            return 1;
        // if the top vars are different, skip the one, which is higher
        if ( dd->perm[S1->index] < dd->perm[S2->index] )
            S1 = cuddT(S1);
        else
            S2 = cuddT(S2);
    }
    return 0;
}